

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

int __thiscall NULLCIO::ReadTextFromConsole(NULLCIO *this,NULLCArray data)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong __n;
  uint uVar4;
  long lVar5;
  uint uVar6;
  char buf [2048];
  char local_829 [2057];
  
  if (this == (NULLCIO *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr",data.ptr,
                    CONCAT44((int)((ulong)register0x00000010 >> 0x20),data.len));
  }
  else if (readFunc != (code *)0x0) {
    lVar5 = 0;
    local_829[1] = 0;
    local_829[0] = '\0';
    do {
      iVar1 = (*readFunc)(contextFunc,local_829,1);
      if ((iVar1 == 0) || (local_829[0] == '\n')) {
        pcVar2 = local_829 + lVar5 + 1;
        goto LAB_00228e65;
      }
      local_829[lVar5 + 1] = local_829[0];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x7ff);
    pcVar2 = local_829 + 0x800;
LAB_00228e65:
    *pcVar2 = '\0';
    uVar4 = (uint)data.ptr;
    if (uVar4 != 0) {
      sVar3 = strlen(local_829 + 1);
      uVar6 = (int)sVar3 + 1;
      if (uVar6 != 0) {
        __n = (ulong)uVar6;
        if (uVar4 < uVar6) {
          __n = (ulong)data.ptr & 0xffffffff;
        }
        memcpy(this,local_829 + 1,__n);
      }
      uVar4 = uVar4 - 1;
      this[uVar4] = (NULLCIO)0x0;
      if (uVar6 < uVar4) {
        return uVar6;
      }
      return uVar4;
    }
  }
  return 0;
}

Assistant:

int ReadTextFromConsole(NULLCArray data)
	{
		if(!data.ptr)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return 0;
		}

		if(!readFunc)
			return 0;

		char buf[2048];
		ReadString(buf, 2048);

		if(!data.len)
			return 0;

		unsigned int len = (unsigned int)strlen(buf) + 1;
		char *target = data.ptr;
		for(unsigned int i = 0; i < (data.len < len ? data.len : len); i++)
			target[i] = buf[i];
		target[data.len - 1] = 0;
		
		return ((unsigned int)len < data.len - 1 ? len : data.len - 1);
	}